

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O1

generic_param_guard __thiscall
cppwinrt::writer::push_generic_params
          (writer *this,pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *params)

{
  uint32_t uVar1;
  table_base *this_00;
  table_base *ptVar2;
  database *this_01;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *ppVar3;
  uint index;
  undefined8 *in_RDX;
  uint32_t row;
  bool bVar4;
  string_view sVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  writer *local_40;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *local_38;
  
  this_00 = (table_base *)*in_RDX;
  ptVar2 = (table_base *)in_RDX[2];
  row = *(uint32_t *)(in_RDX + 1);
  if ((this_00 == ptVar2) && (row == *(uint32_t *)(in_RDX + 3))) {
    (this->super_writer_base<cppwinrt::writer>).m_second.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
  }
  else {
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar1 = *(uint32_t *)(in_RDX + 3);
    local_40 = this;
    local_38 = params;
    if (row != uVar1 || this_00 != ptVar2) {
      do {
        this_01 = this_00->m_database;
        index = winmd::reader::table_base::get_value<unsigned_int>(this_00,row,3);
        sVar5 = winmd::reader::database::get_string(this_01,index);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,sVar5._M_str,sVar5._M_str + sVar5._M_len);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   &local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        bVar4 = uVar1 - 1 != row;
        row = row + 1;
      } while (bVar4 || this_00 != ptVar2);
    }
    ppVar3 = local_38;
    std::
    vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
    ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                *)&local_38[4].first.super_row_base<winmd::reader::GenericParam>.m_index,&local_58);
    this = local_40;
    (local_40->super_writer_base<cppwinrt::writer>).m_second.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)ppVar3;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
  }
  return (generic_param_guard)this;
}

Assistant:

[[nodiscard]] auto push_generic_params(std::pair<GenericParam, GenericParam> const& params)
        {
            if (empty(params))
            {
                return generic_param_guard{ nullptr };
            }

            std::vector<std::string> names;

            for (auto&& param : params)
            {
                names.push_back(std::string{ param.Name() });
            }

            generic_param_stack.push_back(std::move(names));
            return generic_param_guard{ this };
        }